

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.h
# Opt level: O3

void __thiscall FIX::SocketRecvFailed::SocketRecvFailed(SocketRecvFailed *this,ssize_t size)

{
  char *pcVar1;
  char *pcVar2;
  string local_28;
  
  if (size == 0) {
    pcVar2 = "Connection reset by peer.";
    pcVar1 = "";
  }
  else {
    if (size < 0) {
      SocketException::errorToWhat_abi_cxx11_();
      goto LAB_0017c489;
    }
    pcVar2 = "Success.";
    pcVar1 = "";
  }
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_28,pcVar2,pcVar1);
LAB_0017c489:
  SocketException::SocketException(&this->super_SocketException,&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)&(this->super_SocketException).super_Exception = &PTR__Exception_001eafc8;
  return;
}

Assistant:

SocketRecvFailed( ssize_t size )
    : SocketException( size == 0 ? "Connection reset by peer." : size < 0 ? errorToWhat() : "Success." ) {}